

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_listener_create(nng_listener *lp,nng_socket sid,char *addr)

{
  int iVar1;
  uint32_t uVar2;
  nni_sock *local_30;
  nni_sock *s;
  nni_listener *l;
  
  iVar1 = nni_sock_find(&local_30,sid.id);
  if (iVar1 == 0) {
    iVar1 = nni_listener_create((nni_listener **)&s,local_30,addr);
    if (iVar1 == 0) {
      uVar2 = nni_listener_id((nni_listener *)s);
      lp->id = uVar2;
      nni_listener_rele((nni_listener *)s);
      iVar1 = 0;
    }
    else {
      nni_sock_rele(local_30);
    }
  }
  return iVar1;
}

Assistant:

int
nng_listener_create(nng_listener *lp, nng_socket sid, const char *addr)
{
	nni_sock     *s;
	int           rv;
	nni_listener *l;
	nng_listener  lid;

	if ((rv = nni_sock_find(&s, sid.id)) != 0) {
		return (rv);
	}
	if ((rv = nni_listener_create(&l, s, addr)) != 0) {
		nni_sock_rele(s);
		return (rv);
	}
	lid.id = nni_listener_id(l);
	*lp    = lid;
	nni_listener_rele(l);
	return (0);
}